

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O0

int Abc_ObjToGia2(Gia_Man_t *pNew,Abc_Ntk_t *p,Abc_Obj_t *pObj,Vec_Int_t *vTemp,int fUseXors)

{
  int iVar1;
  int iLit1;
  Abc_Obj_t *pAVar2;
  uint local_50;
  int local_44;
  int k;
  Abc_Obj_t *pFanin;
  int fUseXors_local;
  Vec_Int_t *vTemp_local;
  Abc_Obj_t *pObj_local;
  Abc_Ntk_t *p_local;
  Gia_Man_t *pNew_local;
  
  iVar1 = Abc_ObjIsNode(pObj);
  if (iVar1 == 0) {
    __assert_fail("Abc_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbUtil.c"
                  ,0x364,
                  "int Abc_ObjToGia2(Gia_Man_t *, Abc_Ntk_t *, Abc_Obj_t *, Vec_Int_t *, int)");
  }
  Vec_IntClear(vTemp);
  for (local_44 = 0; iVar1 = Abc_ObjFaninNum(pObj), local_44 < iVar1; local_44 = local_44 + 1) {
    pAVar2 = Abc_ObjFanin(pObj,local_44);
    if ((pAVar2->field_6).iTemp < 0) {
      __assert_fail("pFanin->iTemp >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbUtil.c"
                    ,0x368,
                    "int Abc_ObjToGia2(Gia_Man_t *, Abc_Ntk_t *, Abc_Obj_t *, Vec_Int_t *, int)");
    }
    Vec_IntPush(vTemp,(pAVar2->field_6).iTemp);
  }
  iVar1 = Abc_ObjFaninNum(pObj);
  if (iVar1 == 0) {
    iVar1 = Abc_SopIsConst0((char *)(pObj->field_5).pData);
    pNew_local._4_4_ = (uint)(iVar1 == 0);
  }
  else {
    iVar1 = Abc_ObjFaninNum(pObj);
    if (iVar1 == 1) {
      iVar1 = Abc_SopIsBuf((char *)(pObj->field_5).pData);
      if (iVar1 == 0) {
        iVar1 = Vec_IntEntry(vTemp,0);
        local_50 = Abc_LitNot(iVar1);
      }
      else {
        local_50 = Vec_IntEntry(vTemp,0);
      }
      pNew_local._4_4_ = local_50;
    }
    else {
      iVar1 = Abc_ObjFaninNum(pObj);
      if (iVar1 != 2) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbUtil.c"
                      ,0x371,
                      "int Abc_ObjToGia2(Gia_Man_t *, Abc_Ntk_t *, Abc_Obj_t *, Vec_Int_t *, int)");
      }
      iVar1 = Vec_IntEntry(vTemp,0);
      iLit1 = Vec_IntEntry(vTemp,1);
      iVar1 = Gia_ManAppendAnd2(pNew,iVar1,iLit1);
      pNew_local._4_4_ = Abc_LitNot(iVar1);
    }
  }
  return pNew_local._4_4_;
}

Assistant:

int Abc_ObjToGia2( Gia_Man_t * pNew, Abc_Ntk_t * p, Abc_Obj_t * pObj, Vec_Int_t * vTemp, int fUseXors )
{
    Abc_Obj_t * pFanin; int k;
    assert( Abc_ObjIsNode(pObj) );
    Vec_IntClear( vTemp );
    Abc_ObjForEachFanin( pObj, pFanin, k )
    {
        assert( pFanin->iTemp >= 0 );
        Vec_IntPush( vTemp, pFanin->iTemp );
    }
    if ( Abc_ObjFaninNum(pObj) == 0 )
        return Abc_SopIsConst0( (char*)pObj->pData ) ? 0 : 1;
    if ( Abc_ObjFaninNum(pObj) == 1 )
        return Abc_SopIsBuf( (char*)pObj->pData ) ? Vec_IntEntry(vTemp, 0) : Abc_LitNot(Vec_IntEntry(vTemp, 0));
    if ( Abc_ObjFaninNum(pObj) == 2 ) // nand2
        return Abc_LitNot( Gia_ManAppendAnd2( pNew, Vec_IntEntry(vTemp, 0), Vec_IntEntry(vTemp, 1) ) );
    assert( 0 );
    return -1;
}